

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O2

QSslCipher __thiscall
QTlsBackend::createCiphersuite
          (QTlsBackend *this,QString *descriptionOneLine,int bits,int supportedBits)

{
  long lVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  undefined4 uVar6;
  long in_FS_OFFSET;
  QStringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QStringView local_98;
  QStringView local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<QStringView> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QSslCipher::QSslCipher((QSslCipher *)this);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  local_78.ptr = (descriptionOneLine->d).ptr;
  local_78.d = (Data *)(descriptionOneLine->d).size;
  QStringView::split(&local_58,&local_78,0x20,1,1);
  if ((ulong)local_58.size < (undefined1 *)0x6) goto LAB_001c3724;
  **(undefined1 **)this = 0;
  QStringView::toString
            ((QString *)&local_78,(QStringView *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_));
  lVar1 = *(long *)this;
  pDVar3 = *(Data **)(lVar1 + 8);
  pcVar4 = *(char16_t **)(lVar1 + 0x10);
  *(Data **)(lVar1 + 8) = local_78.d;
  *(char16_t **)(lVar1 + 0x10) = local_78.ptr;
  qVar2 = *(qsizetype *)(lVar1 + 0x18);
  *(qsizetype *)(lVar1 + 0x18) = local_78.size;
  local_78.d = pDVar3;
  local_78.ptr = pcVar4;
  local_78.size = qVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  local_88.m_size = *(long *)(CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) + 0x10);
  local_88.m_data =
       *(storage_type_conflict **)(CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) + 0x18);
  QStringView::toString((QString *)&local_78,&local_88);
  lVar1 = *(long *)this;
  pDVar3 = *(Data **)(lVar1 + 0x78);
  pcVar4 = *(char16_t **)(lVar1 + 0x80);
  *(Data **)(lVar1 + 0x78) = local_78.d;
  *(char16_t **)(lVar1 + 0x80) = local_78.ptr;
  qVar2 = *(qsizetype *)(lVar1 + 0x88);
  *(qsizetype *)(lVar1 + 0x88) = local_78.size;
  local_78.d = pDVar3;
  local_78.ptr = pcVar4;
  local_78.size = qVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  *(undefined4 *)(*(long *)this + 0x90) = 0xffffffff;
  s.m_data = L"TLSv1";
  s.m_size = 5;
  bVar5 = QStringView::startsWith(&local_88,s,CaseSensitive);
  if (bVar5) {
    uVar6 = 0;
    if (local_88.m_size != 5) {
      if (local_88.m_data[5] != L'.') goto LAB_001c3587;
      local_78.ptr = local_88.m_data + 6;
      local_78.d = (Data *)(local_88.m_size + -6);
      local_98.m_data = L"3";
      local_98.m_size = 1;
      bVar5 = comparesEqual((QStringView *)&local_78,&local_98);
      if (bVar5) {
        uVar6 = 0xc;
      }
      else {
        local_98.m_data = L"2";
        local_98.m_size = 1;
        bVar5 = comparesEqual((QStringView *)&local_78,&local_98);
        if (bVar5) {
          uVar6 = 2;
        }
        else {
          local_98.m_data = L"1";
          local_98.m_size = 1;
          bVar5 = comparesEqual((QStringView *)&local_78,&local_98);
          uVar6 = 1;
          if (!bVar5) goto LAB_001c3587;
        }
      }
    }
    *(undefined4 *)(*(long *)this + 0x90) = uVar6;
  }
LAB_001c3587:
  s_00.m_data = "Kx=";
  s_00.m_size = 3;
  bVar5 = QStringView::startsWith
                    ((QStringView *)(CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) + 0x20),s_00,
                     CaseSensitive);
  if (bVar5) {
    local_98 = QStringView::mid((QStringView *)
                                (CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) + 0x20),3,-1);
    QStringView::toString((QString *)&local_78,&local_98);
    lVar1 = *(long *)this;
    pDVar3 = *(Data **)(lVar1 + 0x28);
    pcVar4 = *(char16_t **)(lVar1 + 0x30);
    *(Data **)(lVar1 + 0x28) = local_78.d;
    *(char16_t **)(lVar1 + 0x30) = local_78.ptr;
    qVar2 = *(qsizetype *)(lVar1 + 0x38);
    *(qsizetype *)(lVar1 + 0x38) = local_78.size;
    local_78.d = pDVar3;
    local_78.ptr = pcVar4;
    local_78.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  s_01.m_data = "Au=";
  s_01.m_size = 3;
  bVar5 = QStringView::startsWith
                    ((QStringView *)(CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) + 0x30),s_01,
                     CaseSensitive);
  if (bVar5) {
    local_98 = QStringView::mid((QStringView *)
                                (CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) + 0x30),3,-1);
    QStringView::toString((QString *)&local_78,&local_98);
    lVar1 = *(long *)this;
    pDVar3 = *(Data **)(lVar1 + 0x40);
    pcVar4 = *(char16_t **)(lVar1 + 0x48);
    *(Data **)(lVar1 + 0x40) = local_78.d;
    *(char16_t **)(lVar1 + 0x48) = local_78.ptr;
    qVar2 = *(qsizetype *)(lVar1 + 0x50);
    *(qsizetype *)(lVar1 + 0x50) = local_78.size;
    local_78.d = pDVar3;
    local_78.ptr = pcVar4;
    local_78.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  s_02.m_data = "Enc=";
  s_02.m_size = 4;
  bVar5 = QStringView::startsWith
                    ((QStringView *)(CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) + 0x40),s_02,
                     CaseSensitive);
  if (bVar5) {
    local_98 = QStringView::mid((QStringView *)
                                (CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) + 0x40),4,-1);
    QStringView::toString((QString *)&local_78,&local_98);
    lVar1 = *(long *)this;
    pDVar3 = *(Data **)(lVar1 + 0x58);
    pcVar4 = *(char16_t **)(lVar1 + 0x60);
    *(Data **)(lVar1 + 0x58) = local_78.d;
    *(char16_t **)(lVar1 + 0x60) = local_78.ptr;
    qVar2 = *(qsizetype *)(lVar1 + 0x68);
    *(qsizetype *)(lVar1 + 0x68) = local_78.size;
    local_78.d = pDVar3;
    local_78.ptr = pcVar4;
    local_78.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  if ((ulong)local_58.size < (undefined1 *)0x7) {
    bVar5 = false;
  }
  else {
    local_78.d = (Data *)0x6;
    local_78.ptr = L"export";
    bVar5 = comparesEqual((QLatin1StringView *)&local_78,
                          (QStringView *)(CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) + 0x60));
  }
  lVar1 = *(long *)this;
  *(bool *)(lVar1 + 0x70) = bVar5;
  *(int *)(lVar1 + 0x24) = bits;
  *(int *)(lVar1 + 0x20) = supportedBits;
LAB_001c3724:
  QArrayDataPointer<QStringView>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)
         (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)this;
}

Assistant:

QSslCipher QTlsBackend::createCiphersuite(const QString &descriptionOneLine, int bits, int supportedBits)
{
    QSslCipher ciph;

    const auto descriptionList = QStringView{descriptionOneLine}.split(u' ', Qt::SkipEmptyParts);
    if (descriptionList.size() > 5) {
        ciph.d->isNull = false;
        ciph.d->name = descriptionList.at(0).toString();

        QStringView protoString = descriptionList.at(1);
        ciph.d->protocolString = protoString.toString();
        ciph.d->protocol = QSsl::UnknownProtocol;
QT_WARNING_PUSH
QT_WARNING_DISABLE_DEPRECATED
        if (protoString.startsWith(u"TLSv1")) {
            QStringView tail = protoString.sliced(5);
            if (tail.startsWith(u'.')) {
                tail = tail.sliced(1);
                if (tail == u"3")
                    ciph.d->protocol = QSsl::TlsV1_3;
                else if (tail == u"2")
                    ciph.d->protocol = QSsl::TlsV1_2;
                else if (tail == u"1")
                    ciph.d->protocol = QSsl::TlsV1_1;
            } else if (tail.isEmpty()) {
                ciph.d->protocol = QSsl::TlsV1_0;
            }
        }
QT_WARNING_POP

        if (descriptionList.at(2).startsWith("Kx="_L1))
            ciph.d->keyExchangeMethod = descriptionList.at(2).mid(3).toString();
        if (descriptionList.at(3).startsWith("Au="_L1))
            ciph.d->authenticationMethod = descriptionList.at(3).mid(3).toString();
        if (descriptionList.at(4).startsWith("Enc="_L1))
            ciph.d->encryptionMethod = descriptionList.at(4).mid(4).toString();
        ciph.d->exportable = (descriptionList.size() > 6 && descriptionList.at(6) == "export"_L1);

        ciph.d->bits = bits;
        ciph.d->supportedBits = supportedBits;
    }

    return ciph;
}